

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

int lisppathname(char *fullname,char *lispname,int dirp,int versionp)

{
  byte bVar1;
  char cVar2;
  undefined1 *puVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  byte *pbVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  char *unaff_R12;
  char *pcVar15;
  byte *pbVar16;
  byte *pbVar17;
  char ver_buf [16];
  char ver [16];
  char namebuf [4096];
  char fbuf [4096];
  char local_2058 [16];
  char local_2048 [15];
  byte bStack_2039;
  undefined1 local_2038 [2];
  undefined1 auStack_2036 [4094];
  undefined1 local_1038 [4104];
  
  pcVar11 = local_2058;
  if ((*fullname == '/') && (fullname[1] == '\0')) {
    lispname[0] = '<';
    lispname[1] = '\0';
    return 1;
  }
  if (dirp == 0) {
    pcVar7 = lispname;
    unaff_R12 = lispname + -1;
    while( true ) {
      while (cVar2 = *pcVar7, cVar2 == '\'') {
        if (pcVar7[1] == '\0') {
          pcVar7 = pcVar7 + 1;
        }
        else {
          pcVar7 = pcVar7 + 2;
        }
      }
      if (cVar2 == '\0') break;
      pcVar7 = pcVar7 + 1;
      if (cVar2 == '>') {
        unaff_R12 = pcVar7;
      }
    }
    pcVar7 = strrchr(fullname,0x2f);
    pbVar6 = (byte *)(pcVar7 + 1);
  }
  else {
    sVar5 = strlen(fullname);
    pbVar6 = (byte *)(fullname + sVar5);
  }
  local_2038[0] = '<';
  if (fullname[1] == '<') {
    puVar3 = auStack_2036;
    stack0xffffffffffffdfc9 = 0x3c27;
    pbVar16 = (byte *)(fullname + 2);
  }
  else {
    pbVar16 = (byte *)(fullname + 1);
    puVar3 = local_2038;
  }
  pbVar10 = (byte *)((long)puVar3 + 1);
  pbVar17 = pbVar16;
  if (pbVar16 < pbVar6) {
    lVar14 = 0;
    do {
      bVar1 = pbVar16[lVar14];
      if (bVar1 < 0x3b) {
        if (bVar1 != 0x27) {
          if (bVar1 != 0x2f) goto LAB_00136520;
          *pbVar10 = 0x3e;
          goto LAB_00136523;
        }
LAB_00136513:
        *pbVar10 = 0x27;
        pbVar10[1] = bVar1;
        pbVar10 = pbVar10 + 2;
      }
      else {
        if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) goto LAB_00136513;
LAB_00136520:
        *pbVar10 = bVar1;
LAB_00136523:
        pbVar10 = pbVar10 + 1;
      }
      lVar14 = lVar14 + 1;
      pbVar17 = pbVar6;
    } while ((long)pbVar6 - (long)pbVar16 != lVar14);
  }
  if (dirp == 0) {
    uVar4 = 0;
    uVar12 = 1;
    do {
      while( true ) {
        pcVar7 = unaff_R12 + 1;
        pcVar15 = unaff_R12 + 1;
        if (*pcVar7 != '.') break;
        if (pcVar15 != lispname) {
          uVar13 = 0;
          if (*unaff_R12 == '\'') {
            uVar13 = uVar12;
          }
          uVar4 = uVar4 | uVar13;
        }
        uVar12 = uVar12 * 2;
        unaff_R12 = pcVar15;
      }
      unaff_R12 = pcVar15;
    } while (*pcVar7 != '\0');
    uVar12 = 1;
LAB_0013658b:
    bVar1 = *pbVar17;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) {
LAB_001365bf:
        *pbVar10 = 0x27;
        pbVar10[1] = *pbVar17;
        pbVar10 = pbVar10 + 2;
      }
      else {
        if (bVar1 != 0x2e) {
          if (bVar1 != 0) goto LAB_001365d3;
          *pbVar10 = 0;
          strcpy(local_1038,local_2038);
          pcVar7 = local_1038;
          pcVar15 = local_1038;
          while( true ) {
            while (pcVar8 = pcVar7, cVar2 = *pcVar8, cVar2 == '\'') {
              if (pcVar8[1] == '\0') goto LAB_00136628;
              pcVar7 = pcVar8 + 2;
            }
            if (cVar2 == '\0') break;
            if (cVar2 == '>') {
              pcVar7 = pcVar8 + 1;
              pcVar15 = pcVar8;
            }
            else {
LAB_00136628:
              pcVar7 = pcVar8 + 1;
            }
          }
          pcVar15 = pcVar15 + 1;
          if (versionp != 0) {
            separate_version(local_1038,local_2048,1);
          }
          while (cVar2 = *pcVar15, cVar2 != '\0') {
            if (cVar2 == '\'') {
              if (pcVar15[1] == '\0') goto LAB_00136668;
              pcVar15 = pcVar15 + 2;
            }
            else {
              if (cVar2 == '.') goto LAB_00136678;
LAB_00136668:
              pcVar15 = pcVar15 + 1;
            }
          }
          pcVar15[0] = '.';
          pcVar15[1] = '\0';
LAB_00136678:
          strcpy(local_2038,local_1038);
          if ((versionp == 0) || (local_2048[0] == '\0')) {
            if (versionp == 0) goto LAB_001367d2;
          }
          else {
            sVar5 = strlen(local_2038);
            *(undefined2 *)(local_2038 + sVar5) = 0x7e2e;
            auStack_2036[sVar5] = 0;
            strcat(local_2038,local_2048);
            sVar5 = strlen(local_2038);
            *(undefined2 *)(local_2038 + sVar5) = 0x7e;
          }
          pcVar15 = strchr(local_2038,0x7e);
          pcVar7 = pcVar15;
          if (pcVar15 != (char *)0x0) {
            do {
              pcVar8 = pcVar7;
              lVar14 = 1;
              while( true ) {
                if (pcVar8[lVar14] == '\0') {
                  if ((pcVar15 == pcVar8) || (lVar14 != 1 || pcVar15[-1] != '.')) goto LAB_001367bc;
                  strncpy(local_2058,pcVar15 + 1,(size_t)(pcVar8 + ~(ulong)pcVar15));
                  local_2058[(long)(pcVar8 + ~(ulong)pcVar15)] = '\0';
                  if (local_2058[0] == '\0') goto LAB_001367bc;
                  goto LAB_0013676e;
                }
                if (pcVar8[lVar14] == '~') break;
                lVar14 = lVar14 + 1;
              }
              pcVar7 = pcVar8 + lVar14;
              pcVar15 = pcVar8;
            } while( true );
          }
LAB_001367bc:
          sVar5 = strlen(local_2038);
          *(undefined2 *)(local_2038 + sVar5) = 0x313b;
          auStack_2036[sVar5] = 0;
          goto LAB_001367d2;
        }
        if ((uVar12 & ~uVar4) == 0) {
          *pbVar10 = 0x27;
          pbVar10[1] = *pbVar17;
          pbVar10 = pbVar10 + 2;
        }
        else {
          *pbVar10 = 0x2e;
          pbVar10 = pbVar10 + 1;
        }
        uVar12 = uVar12 * 2;
      }
    }
    else {
      if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) goto LAB_001365bf;
LAB_001365d3:
      *pbVar10 = bVar1;
      pbVar10 = pbVar10 + 1;
    }
    pbVar17 = pbVar17 + 1;
    goto LAB_0013658b;
  }
  if ((pbVar10[-1] != 0x3e) || (pbVar10[-2] == 0x27)) {
    *pbVar10 = 0x3e;
    pbVar10 = pbVar10 + 1;
  }
  *pbVar10 = 0;
  goto LAB_001367d2;
  while (local_2058[0] = *pcVar11, local_2058[0] != '\0') {
LAB_0013676e:
    pcVar11 = pcVar11 + 1;
    if ((byte)(local_2058[0] - 0x3aU) < 0xf6) goto LAB_001367bc;
  }
  pcVar15[-1] = ';';
  pcVar15[0] = '\0';
  *pcVar8 = '\0';
  uVar9 = strtoul(pcVar15 + 1,(char **)0x0,10);
  sprintf(local_2058,"%u",uVar9 & 0xffffffff);
  strcat(local_2038,local_2058);
LAB_001367d2:
  strcpy(lispname,local_2038);
  return 1;
}

Assistant:

int lisppathname(char *fullname, char *lispname, int dirp, int versionp)
{
  char *cp, *dp, *lnamep, *cnamep;
  char namebuf[MAXPATHLEN], fbuf[MAXPATHLEN], ver[VERSIONLEN];
  int i, mask, extensionp;

  if (strcmp(fullname, DIRSEPSTR) == 0) {
    strcpy(lispname, "<");
    return (1);
  }

#ifdef DOS
  /* Split off the drive, if there is one. */
  if (fullname[1] == DRIVESEP) {
    *lispname++ = *fullname++;
    *lispname++ = *fullname++;
  }
#endif
  
  if (!dirp) {
    /*
     * The characters which are dealt with specially (i.e. are quoted)
     * in the Xerox Lisp file naming convention are all valid in UNIX
     * file name convention.  So the conversion rule is almost
     * straightforward except the "extension" field.  Only glancing
     * the UNIX file name, we cannot determine which period character
     * should be quoted in the result Xerox Lisp file name when more
     * than one period are included in the UNIX file name.  In such
     * case, we have to refer to the Xerox Lisp file name representation
     * which is specified the user.  Thus, at first, extract the
     * name field from the original Lisp file name.
     */
    cp = lispname;
    lnamep = cp - 1;
    while (*cp != '\0') {
      switch (*cp) {
        case '>':
          lnamep = cp + 1;
          cp++;
          break;

        case '\'':
          if (*(cp + 1) != '\0')
            cp += 2;
          else
            cp++;
          break;

        default: cp++; break;
      }
    }
    /* Name field in the UNIX file name representation. */
    cnamep = strrchr(fullname, DIRSEP) + 1;
  } else {
    cnamep = fullname + strlen(fullname);
  }

  /*
   * Conversion rule of file name from UNIX to Xerox Lisp.
   *	UNIX		Lisp
   *	/		<    only if it is used as a root directory
   *			     delimiter.
   *	/		>    if used as a directory delimiter for other
   *			     directories than root directory.
   *	>		'>
   *	;		';
   *	'		''
   *	.		'.   only if it is used as a part of the extension
   *			     field.
   *	others		as if
   */

  cp = fullname + 1;
  dp = namebuf;
  *dp++ = '<';

  if (*cp == '<') {
    /*
     * If the first character of the initial directory is '<',
     * it should be quoted in the result Lisp file name.
     */
    *dp++ = '\'';
    *dp++ = *cp++;
  }

  while (cp < cnamep) {
    switch (*cp) {
      case '>':
      case ';':
#ifndef DOS
      case '\'':
#endif /* DOS */
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

#ifdef DOS
      case '/':
#endif
      case DIRSEP:
        *dp++ = '>';
        cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  if (dirp) {
    if (*(dp - 1) != '>' || *(dp - 2) == '\'') *dp++ = '>';
    *dp = '\0';
    strcpy(lispname, namebuf);
    return (1);
  }

  /*
   * Be careful dealing with the extension field.  If we encounter with the
   * period mark which was quoted in the original Lisp file name, we have
   * to quote it in the result file name.
   * First we count the period mark included in the Lisp file name, and
   * remember the position of the quoted period.  Then when we met the
   * period while we are converting the UNIX file name into Lisp one,
   * examine it if it is a quoted one or not, then if so, we quote it.
   */

  mask = 0;
  i = 1;
  lnamep++;

  while (*lnamep) {
    if (*lnamep == '.') {
      if (lnamep != lispname && *(lnamep - 1) == '\'') mask |= i;
      i <<= 1;
    }
    lnamep++;
  }

  i = 1;
  while (*cp) {
    switch (*cp) {
#ifdef DOS
      case DIRSEP:
        *dp++ = '/';
        cp++;
        break;
#endif
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      case '.':
        if ((i & mask) == i) {
          /* This period should be quoted. */
          *dp++ = '\'';
          *dp++ = *cp++;
        } else {
          *dp++ = *cp++;
        }
        i <<= 1;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file name
   * or not.  If extension field is not included, we have to add a period
   * to specify empty extension field.
   */
  strcpy(fbuf, namebuf);
  dp = cp = fbuf;
  while (*cp) {
    switch (*cp) {
      case '>':
        dp = cp;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  cp = dp + 1;
  if (versionp) separate_version(fbuf, ver, 1);
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.': extensionp = 1; break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    *cp++ = '.';
    *cp = '\0';
  }
  if (versionp && *ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }

  /*
   * Now, it's time to convert the version field.
   */
  if (!dirp && versionp) UnixVersionToLispVersion(namebuf, 0);

  strcpy(lispname, namebuf);
  return (1);
}